

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

int sat_solver_clause_new(sat_solver *s,lit *begin,lit *end,int learnt)

{
  ABC_INT64_T *pAVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  int *piVar6;
  veci *pvVar7;
  ulong uVar8;
  veci *pvVar9;
  int in_R8D;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  
  lVar16 = (long)end - (long)begin >> 2;
  if (lVar16 < 2) {
    __assert_fail("end - begin > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x21a,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if (1 < (uint)learnt) {
    __assert_fail("learnt >= 0 && learnt < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x21b,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  iVar15 = (int)lVar16;
  if (iVar15 == 2 && learnt == 0) {
    uVar8 = (long)*begin ^ 1;
    pvVar7 = s->wlists;
    pvVar9 = pvVar7 + uVar8;
    iVar15 = begin[1];
    uVar3 = pvVar7[uVar8].size;
    if (uVar3 == pvVar7[uVar8].cap) {
      iVar14 = (uVar3 >> 1) * 3;
      if ((int)uVar3 < 4) {
        iVar14 = uVar3 * 2;
      }
      if (pvVar9->ptr == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar14 << 2);
      }
      else {
        piVar6 = (int *)realloc(pvVar9->ptr,(long)iVar14 << 2);
      }
      pvVar9->ptr = piVar6;
      if (piVar6 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pvVar9->cap * 9.5367431640625e-07,(double)iVar14 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      pvVar9->cap = iVar14;
      uVar3 = pvVar9->size;
      pvVar7 = s->wlists;
    }
    pvVar9->size = uVar3 + 1;
    pvVar9->ptr[(int)uVar3] = iVar15 * 2 + 1;
    uVar8 = (long)begin[1] ^ 1;
    pvVar9 = pvVar7 + uVar8;
    iVar15 = *begin;
    uVar3 = pvVar7[uVar8].size;
    if (uVar3 == pvVar7[uVar8].cap) {
      iVar14 = (uVar3 >> 1) * 3;
      if ((int)uVar3 < 4) {
        iVar14 = uVar3 * 2;
      }
      if (pvVar9->ptr == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar14 << 2);
      }
      else {
        piVar6 = (int *)realloc(pvVar9->ptr,(long)iVar14 << 2);
      }
      pvVar9->ptr = piVar6;
      if (piVar6 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pvVar9->cap * 9.5367431640625e-07,(double)iVar14 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      pvVar9->cap = iVar14;
      uVar3 = pvVar9->size;
    }
    pvVar9->size = uVar3 + 1;
    pvVar9->ptr[(int)uVar3] = iVar15 * 2 + 1;
    puVar5 = &(s->stats).clauses;
    *puVar5 = *puVar5 + 1;
    pAVar1 = &(s->stats).clauses_literals;
    *pAVar1 = *pAVar1 + 2;
    return 0;
  }
  uVar3 = Sat_MemAppend(&s->Mem,begin,iVar15,learnt,in_R8D);
  if ((uVar3 & 1) != 0) {
    __assert_fail("!(h & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x22b,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if ((learnt == 0) || (s->hLearnts != -1)) {
    if (learnt == 0) {
      puVar5 = &(s->stats).clauses;
      *puVar5 = *puVar5 + 1;
      lVar16 = 0x1c0;
      goto LAB_00553236;
    }
  }
  else {
    s->hLearnts = uVar3;
  }
  uVar11 = 0;
  if (uVar3 == 0) {
    puVar5 = (uint *)0x0;
  }
  else {
    uVar4 = (s->Mem).uPageMask & uVar3;
    if (uVar4 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                    ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    puVar5 = (uint *)((s->Mem).pPages[(int)uVar3 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar4)
    ;
  }
  uVar4 = *puVar5;
  if (uVar4 < 0x800) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)(uVar4 >> 0xb);
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    do {
      uVar13 = 1 << ((byte)s->levels[(int)puVar5[uVar10 + 1] >> 1] & 0x1f);
      bVar17 = (uVar12 >> (s->levels[(int)puVar5[uVar10 + 1] >> 1] & 0x1fU) & 1) != 0;
      if (bVar17) {
        uVar13 = 0;
      }
      uVar11 = (uVar11 + 1) - (uint)bVar17;
      uVar12 = uVar12 | uVar13;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
    uVar11 = (uVar11 & 0xff) << 3;
  }
  *puVar5 = uVar4 & 0xfffff807 | uVar11;
  uVar11 = puVar5[uVar8 + 1];
  if (uVar11 != (s->act_clas).size) {
    __assert_fail("clause_id(c) == veci_size(&s->act_clas)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x232,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if (s->ClaActType == 0) {
    uVar4 = 0x400;
    if (uVar11 == (s->act_clas).cap) {
      iVar14 = (uVar11 >> 1) * 3;
      if ((int)uVar11 < 4) {
        iVar14 = uVar11 * 2;
      }
      piVar6 = (s->act_clas).ptr;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar14 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)iVar14 << 2);
      }
      (s->act_clas).ptr = piVar6;
      uVar4 = 0x400;
      goto joined_r0x00553420;
    }
  }
  else {
    uVar4 = s->cla_inc;
    if (uVar11 == (s->act_clas).cap) {
      iVar14 = (uVar11 >> 1) * 3;
      if ((int)uVar11 < 4) {
        iVar14 = uVar11 * 2;
      }
      piVar6 = (s->act_clas).ptr;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar14 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)iVar14 << 2);
      }
      (s->act_clas).ptr = piVar6;
joined_r0x00553420:
      if (piVar6 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->act_clas).cap * 9.5367431640625e-07,(double)iVar14 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      (s->act_clas).cap = iVar14;
      uVar11 = (s->act_clas).size;
    }
  }
  (s->act_clas).size = uVar11 + 1;
  (s->act_clas).ptr[(int)uVar11] = uVar4;
  puVar5 = &(s->stats).learnts;
  *puVar5 = *puVar5 + 1;
  lVar16 = 0x1c8;
LAB_00553236:
  plVar2 = (long *)((long)(s->Mem).nEntries + lVar16 + -0x10);
  *plVar2 = *plVar2 + (long)(int)((ulong)((long)end - (long)begin) >> 2);
  uVar11 = *begin;
  if ((int)uVar11 < 0) {
    __assert_fail("begin[0] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x242,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  uVar4 = s->size * 2;
  if ((int)uVar4 <= (int)uVar11) {
    __assert_fail("begin[0] < s->size*2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x243,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  uVar12 = begin[1];
  if ((int)uVar12 < 0) {
    __assert_fail("begin[1] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x244,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if (uVar12 < uVar4) {
    uVar8 = (ulong)uVar11 ^ 1;
    if (uVar4 <= (uint)uVar8) {
      __assert_fail("lit_neg(begin[0]) < s->size*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x247,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    if ((uVar12 ^ 1) < uVar4) {
      pvVar9 = s->wlists;
      uVar11 = uVar12 * 2 + 1;
      if (2 < iVar15) {
        uVar11 = uVar3;
      }
      pvVar7 = pvVar9 + uVar8;
      uVar4 = pvVar9[uVar8].size;
      if (uVar4 == pvVar9[uVar8].cap) {
        iVar14 = (uVar4 >> 1) * 3;
        if ((int)uVar4 < 4) {
          iVar14 = uVar4 * 2;
        }
        if (pvVar7->ptr == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar14 << 2);
        }
        else {
          piVar6 = (int *)realloc(pvVar7->ptr,(long)iVar14 << 2);
        }
        pvVar7->ptr = piVar6;
        if (piVar6 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)pvVar7->cap * 9.5367431640625e-07,(double)iVar14 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        pvVar7->cap = iVar14;
        uVar4 = pvVar7->size;
        pvVar9 = s->wlists;
      }
      pvVar7->size = uVar4 + 1;
      pvVar7->ptr[(int)uVar4] = uVar11;
      pvVar9 = pvVar9 + ((long)begin[1] ^ 1);
      uVar11 = uVar3;
      if (iVar15 < 3) {
        uVar11 = *begin * 2 + 1;
      }
      uVar4 = pvVar9->size;
      if (uVar4 == pvVar9->cap) {
        iVar15 = (uVar4 >> 1) * 3;
        if ((int)uVar4 < 4) {
          iVar15 = uVar4 * 2;
        }
        if (pvVar9->ptr == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar15 << 2);
        }
        else {
          piVar6 = (int *)realloc(pvVar9->ptr,(long)iVar15 << 2);
        }
        pvVar9->ptr = piVar6;
        if (piVar6 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)pvVar9->cap * 9.5367431640625e-07,(double)iVar15 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        pvVar9->cap = iVar15;
        uVar4 = pvVar9->size;
      }
      pvVar9->size = uVar4 + 1;
      pvVar9->ptr[(int)uVar4] = uVar11;
      return uVar3;
    }
    __assert_fail("lit_neg(begin[1]) < s->size*2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x248,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  __assert_fail("begin[1] < s->size*2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                ,0x245,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
}

Assistant:

int sat_solver_clause_new(sat_solver* s, lit* begin, lit* end, int learnt)
{
    int fUseBinaryClauses = 1;
    int size;
    clause* c;
    int h;

    assert(end - begin > 1);
    assert(learnt >= 0 && learnt < 2);
    size           = end - begin;

    // do not allocate memory for the two-literal problem clause
    if ( fUseBinaryClauses && size == 2 && !learnt )
    {
        veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),(clause_from_lit(begin[1])));
        veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),(clause_from_lit(begin[0])));
        s->stats.clauses++;
        s->stats.clauses_literals += size;
        return 0;
    }

    // create new clause
//    h = Vec_SetAppend( &s->Mem, NULL, size + learnt + 1 + 1 ) << 1;
    h = Sat_MemAppend( &s->Mem, begin, size, learnt, 0 );
    assert( !(h & 1) );
    if ( s->hLearnts == -1 && learnt )
        s->hLearnts = h;
    if (learnt)
    {
        c = clause_read( s, h );
        c->lbd = sat_clause_compute_lbd( s, c );
        assert( clause_id(c) == veci_size(&s->act_clas) );
//        veci_push(&s->learned, h);
//        act_clause_bump(s,clause_read(s, h));
        if ( s->ClaActType == 0 )
            veci_push(&s->act_clas, (1<<10));
        else
            veci_push(&s->act_clas, s->cla_inc);
        s->stats.learnts++;
        s->stats.learnts_literals += size;
    }
    else
    {
        s->stats.clauses++;
        s->stats.clauses_literals += size;
    }

    assert(begin[0] >= 0);
    assert(begin[0] < s->size*2);
    assert(begin[1] >= 0);
    assert(begin[1] < s->size*2);

    assert(lit_neg(begin[0]) < s->size*2);
    assert(lit_neg(begin[1]) < s->size*2);

    //veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),c);
    //veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),c);
    veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),(size > 2 ? h : clause_from_lit(begin[1])));
    veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),(size > 2 ? h : clause_from_lit(begin[0])));

    return h;
}